

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_test.cc
# Opt level: O2

void __thiscall leveldb::BloomTest::Build(BloomTest *this)

{
  pointer pbVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  Slice local_58;
  vector<leveldb::Slice,_std::allocator<leveldb::Slice>_> key_slices;
  
  key_slices.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_slices.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_slices.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 8;
  for (uVar2 = 0;
      pbVar1 = (this->keys_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->keys_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar2 = uVar2 + 1) {
    local_58.data_ = *(char **)((long)pbVar1 + lVar3 + -8);
    local_58.size_ = *(size_t *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::emplace_back<leveldb::Slice>
              (&key_slices,&local_58);
    lVar3 = lVar3 + 0x20;
  }
  (this->filter_)._M_string_length = 0;
  *(this->filter_)._M_dataplus._M_p = '\0';
  (*this->policy_->_vptr_FilterPolicy[3])
            (this->policy_,
             key_slices.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
             super__Vector_impl_data._M_start,
             (ulong)((long)key_slices.
                           super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)key_slices.
                          super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 4,&this->filter_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->keys_);
  std::_Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>::~_Vector_base
            (&key_slices.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>);
  return;
}

Assistant:

void Build() {
    std::vector<Slice> key_slices;
    for (size_t i = 0; i < keys_.size(); i++) {
      key_slices.push_back(Slice(keys_[i]));
    }
    filter_.clear();
    policy_->CreateFilter(&key_slices[0], static_cast<int>(key_slices.size()),
                          &filter_);
    keys_.clear();
    if (kVerbose >= 2) DumpFilter();
  }